

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::sort(array<irr::CIrrDeviceSDL::SKeyMap> *this)

{
  iterator __first;
  iterator __last;
  long in_RDI;
  vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
  *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    __first = ::std::
              vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>::
              begin(in_stack_ffffffffffffffd8);
    __last = ::std::
             vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>::end
                       (in_stack_ffffffffffffffd8);
    ::std::
    sort<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>>
              ((__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                )__first._M_current,
               (__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                )__last._M_current);
    *(undefined1 *)(in_RDI + 0x18) = 1;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}